

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void close_socket(DESCRIPTOR_DATA *dclose)

{
  time_t tVar1;
  int iVar2;
  DESCRIPTOR_DATA *pDVar3;
  DESCRIPTOR_DATA *pDVar4;
  time_t tVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  CHAR_DATA *pCVar9;
  string_view fmt;
  string_view fmt_00;
  char buf [4608];
  char acStack_1228 [4608];
  
  if (0 < dclose->outtop) {
    process_output(dclose,false);
  }
  pDVar3 = descriptor_list;
  if (dclose->snoop_by != (DESCRIPTOR_DATA *)0x0) {
    write_to_buffer(dclose->snoop_by,"Your victim has left the game.\n\r",0);
    pDVar3 = descriptor_list;
  }
  for (; pDVar3 != (DESCRIPTOR_DATA *)0x0; pDVar3 = pDVar3->next) {
    if (pDVar3->snoop_by == dclose) {
      pDVar3->snoop_by = (DESCRIPTOR_DATA *)0x0;
    }
  }
  pCVar9 = dclose->character;
  if (pCVar9 != (CHAR_DATA *)0x0) {
    fmt._M_str = "Closing link to {}.";
    fmt._M_len = 0x13;
    CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&pCVar9->name);
    iVar2 = (int)current_time;
    if ((dclose->connected == 0) && (merc_down == false)) {
      tVar1 = pCVar9->last_fight_time;
      tVar5 = tVar1;
      if (pCVar9->invis_level < 0x33) {
        act_new("$n has lost $s link.",pCVar9,(void *)0x0,(void *)0x0,0,5);
        tVar5 = pCVar9->last_fight_time;
      }
      uVar8 = iVar2 - (int)tVar1;
      pcVar7 = "nobody";
      if (pCVar9->last_fight_name != (char *)0x0) {
        pcVar7 = pCVar9->last_fight_name;
      }
      if (tVar5 == 0) {
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = (ulong)uVar8;
        if (600 < (int)uVar8) {
          uVar6 = (ulong)uVar8 / 0x3c;
        }
      }
      sprintf(acStack_1228,"$N has lost $S link (Last fought %s %d %s ago).",pcVar7,uVar6);
      iVar2 = get_trust(pCVar9);
      wiznet(acStack_1228,pCVar9,(OBJ_DATA *)0x0,4,0,iVar2);
      pCVar9->desc = (DESCRIPTOR_DATA *)0x0;
    }
    else {
      pCVar9 = dclose->original;
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pCVar9 = dclose->character;
      }
      free_char(pCVar9);
    }
  }
  if (d_next == dclose) {
    d_next = d_next->next;
  }
  pDVar3 = descriptor_list;
  if (descriptor_list == dclose) {
    descriptor_list = descriptor_list->next;
  }
  else {
    do {
      pDVar4 = pDVar3;
      if (pDVar4 == (DESCRIPTOR_DATA *)0x0) {
        fmt_00._M_str = "Close_socket: dclose not found.";
        fmt_00._M_len = 0x1f;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        goto LAB_0027406e;
      }
      pDVar3 = pDVar4->next;
    } while (pDVar4->next != dclose);
    pDVar4->next = dclose->next;
  }
LAB_0027406e:
  close((int)dclose->descriptor);
  free_descriptor(dclose);
  return;
}

Assistant:

void close_socket(DESCRIPTOR_DATA *dclose)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH];

	if (dclose->outtop > 0)
		process_output(dclose, false);

	if (dclose->snoop_by != nullptr)
	{
		write_to_buffer(dclose->snoop_by, "Your victim has left the game.\n\r", 0);
	}

	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == dclose)
				d->snoop_by = nullptr;
		}
	}

	if ((ch = dclose->character) != nullptr)
	{
		RS.Logger.Info("Closing link to {}.", ch->name);

		/* cut down on wiznet spam when rebooting */
		if (dclose->connected == CON_PLAYING && !merc_down)
		{
			int ftime = current_time - ch->last_fight_time;
			if (ch->invis_level < 51)
				act("$n has lost $s link.", ch, nullptr, nullptr, TO_ROOM);

			sprintf(buf, "$N has lost $S link (Last fought %s %d %s ago).",
				ch->last_fight_name != nullptr ? ch->last_fight_name : "nobody",
				ch->last_fight_time ? ftime > 600 ? (int)(ftime / 60) : ftime : -1,
				ftime > 600 ? "minutes" : "seconds");
			wiznet(buf, ch, nullptr, WIZ_LINKS, 0, get_trust(ch));

			ch->desc = nullptr;
		}
		else
		{
			free_char(dclose->original ? dclose->original : dclose->character);
		}
	}

	if (d_next == dclose)
		d_next = d_next->next;

	if (dclose == descriptor_list)
	{
		descriptor_list = descriptor_list->next;
	}
	else
	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d && d->next != dclose; d = d->next);

		if (d != nullptr)
			d->next = dclose->next;
		else
			RS.Logger.Warn("Close_socket: dclose not found.");
	}

	close(dclose->descriptor);
	free_descriptor(dclose);
	return;
}